

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diagnostics.h
# Opt level: O2

void __thiscall
flow::diagnostics::Report::emplace_back(Report *this,Type ty,SourceLocation *sl,string *t)

{
  string local_e0;
  SourceLocation local_c0;
  Message local_88;
  
  SourceLocation::SourceLocation(&local_c0,sl);
  std::__cxx11::string::string((string *)&local_e0,(string *)t);
  Message::Message(&local_88,ty,&local_c0,&local_e0);
  (*this->_vptr_Report[2])(this,&local_88);
  Message::~Message(&local_88);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

void emplace_back(Type ty, SourceLocation sl, std::string t) {
    push_back(Message(ty, std::move(sl), std::move(t)));
  }